

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

int posix_gai_errno(int rv)

{
  int *piVar1;
  int local_c;
  int rv_local;
  
  if (rv == -0x65) {
    local_c = 0x14;
  }
  else if (rv == -0xb) {
    piVar1 = __errno_location();
    local_c = nni_plat_errno(*piVar1);
  }
  else if (rv == -10) {
    local_c = 2;
  }
  else {
    if (rv != -8) {
      if (rv == -7) {
        return 9;
      }
      if (rv != -5) {
        if (rv == -3) {
          return 8;
        }
        if (rv != -2) {
          if (rv == -1) {
            return 3;
          }
          if (rv == 0) {
            return 0;
          }
          return rv + 0x10000000;
        }
      }
    }
    local_c = 0xf;
  }
  return local_c;
}

Assistant:

static int
posix_gai_errno(int rv)
{
	switch (rv) {
	case 0:
		return (0);

	case EAI_MEMORY:
		return (NNG_ENOMEM);

	case EAI_SYSTEM:
		return (nni_plat_errno(errno));

	case EAI_NONAME:
#ifdef EAI_NODATA
	case EAI_NODATA:
#endif
	case EAI_SERVICE:
		return (NNG_EADDRINVAL);

	case EAI_BADFLAGS:
		return (NNG_EINVAL);

	case EAI_SOCKTYPE:
		return (NNG_ENOTSUP);

#ifdef EAI_CANCELED
	case EAI_CANCELED:
		return (NNG_ECANCELED);
#endif

#ifdef EAI_AGAIN
	case EAI_AGAIN:
		return (NNG_EAGAIN);
#endif

	default:
		return (NNG_ESYSERR + rv);
	}
}